

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::ClearTest::TestClearDepthAndStencil
          (ClearTest *this,GLfloat depth,GLint stencil)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  Enum<int,_2UL> EVar8;
  MessageBuilder local_368;
  int local_1e8;
  GLfloat local_1e4;
  GLint the_stencil;
  GLfloat the_depth;
  int local_1d8;
  Enum<int,_2UL> local_1d0 [2];
  MessageBuilder local_1b0;
  int local_2c;
  long lStack_28;
  GLenum error;
  Functions *gl;
  GLint stencil_local;
  GLfloat depth_local;
  ClearTest *this_local;
  
  gl._0_4_ = stencil;
  gl._4_4_ = depth;
  _stencil_local = this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lStack_28 + 0x1e8))(gl._4_4_,this->m_fbo,0x84f9,0,(GLint)gl);
  local_2c = (**(code **)(lStack_28 + 0x800))();
  if (local_2c == 0) {
    local_1e4 = 0.0;
    local_1e8 = 0;
    (**(code **)(lStack_28 + 0x1220))(0,0,1,1,0x1902,0x1406,&local_1e4);
    dVar3 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar3,"glReadPixel has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x95d);
    (**(code **)(lStack_28 + 0x1220))(0,0,1,1,0x1901,0x1404,&local_1e8);
    dVar3 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar3,"glReadPixel has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x960);
    bVar1 = Compare<float>(this,local_1e4,gl._4_4_);
    if ((!bVar1) && (bVar1 = Compare<int>(this,local_1e8,(GLint)gl), !bVar1)) {
      pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar6 = tcu::TestContext::getLog(pTVar5);
      tcu::TestLog::operator<<(&local_368,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_368,
                          (char (*) [85])
                          "ClearNamedFramebufferfi did not cleared depth/stencil attachment of the framebuffer."
                         );
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_368);
      return true;
    }
    this_local._7_1_ = true;
  }
  else {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_1b0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [49])"ClearNamedFramebufferufi unexpectedly generated "
                       );
    EVar8 = glu::getErrorStr(local_2c);
    _the_stencil = EVar8.m_getName;
    local_1d8 = EVar8.m_value;
    local_1d0[0].m_getName = _the_stencil;
    local_1d0[0].m_value = local_1d8;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_1d0);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [20])" error. Test fails.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ClearTest::TestClearDepthAndStencil(glw::GLfloat depth, glw::GLint stencil)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Clearing depth and stencil. */
	gl.clearNamedFramebufferfi(m_fbo, GL_DEPTH_STENCIL, 0, depth, stencil);

	if (glw::GLenum error = gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "ClearNamedFramebufferufi unexpectedly generated " << glu::getErrorStr(error)
			<< " error. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	/* Clear. */
	/* Fetching framebuffer content. */
	glw::GLfloat the_depth   = 0.f;
	glw::GLint   the_stencil = 0;

	gl.readPixels(0, 0, 1, 1, GL_DEPTH_COMPONENT, GL_FLOAT, &the_depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixel has failed");

	gl.readPixels(0, 0, 1, 1, GL_STENCIL_INDEX, GL_INT, &the_stencil);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixel has failed");

	/* Comparison with reference value. */
	if (Compare(the_depth, depth) || Compare(the_stencil, stencil))
	{
		return true;
	}

	m_context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< "ClearNamedFramebufferfi did not cleared depth/stencil attachment of the framebuffer."
		<< tcu::TestLog::EndMessage;

	return true;
}